

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thermo.cpp
# Opt level: O2

RealType __thiscall OpenMD::Thermo::getGyrationalVolume(Thermo *this)

{
  Snapshot *this_00;
  double dVar1;
  double dVar2;
  RealType RVar3;
  Vector3d dummyAngMom;
  Mat3x3d intTensor;
  Vector<double,_3U> local_80;
  SquareMatrix<double,_3> local_68;
  
  this_00 = this->info_->sman_->currentSnapshot_;
  if (this_00->hasGyrationalVolume == false) {
    SquareMatrix<double,_3>::SquareMatrix(&local_68);
    Vector<double,_3U>::Vector(&local_80);
    getInertiaTensor(this,(Mat3x3d *)&local_68,(Vector3d *)&local_80);
    dVar1 = SquareMatrix3<double>::determinant((SquareMatrix3<double> *)&local_68);
    dVar2 = pow(1.5 / (double)this->info_->nGlobalIntegrableObjects_,1.5);
    if (dVar1 < 0.0) {
      dVar1 = sqrt(dVar1);
    }
    else {
      dVar1 = SQRT(dVar1);
    }
    Snapshot::setGyrationalVolume(this_00,dVar2 * 4.1887902047863905 * dVar1);
  }
  RVar3 = Snapshot::getGyrationalVolume(this_00);
  return RVar3;
}

Assistant:

RealType Thermo::getGyrationalVolume() {
    Snapshot* snap = info_->getSnapshotManager()->getCurrentSnapshot();

    if (!snap->hasGyrationalVolume) {
      Mat3x3d intTensor;
      RealType det;
      Vector3d dummyAngMom;
      RealType sysconstants;
      RealType geomCnst;
      RealType volume;

      geomCnst = 3.0 / 2.0;
      /* Get the inertial tensor and angular momentum for free*/
      getInertiaTensor(intTensor, dummyAngMom);

      det = intTensor.determinant();
      sysconstants =
          geomCnst / (RealType)(info_->getNGlobalIntegrableObjects());
      volume =
          4.0 / 3.0 * Constants::PI * pow(sysconstants, geomCnst) * sqrt(det);

      snap->setGyrationalVolume(volume);
    }
    return snap->getGyrationalVolume();
  }